

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

void __thiscall
capnp::compiler::NodeTranslator::compileNode(NodeTranslator *this,Reader decl,Builder builder)

{
  Reader nestedDecls;
  Reader decl_00;
  Reader decl_01;
  Reader decl_02;
  Reader annotations;
  Builder builder_00;
  Builder builder_01;
  Reader members;
  Builder builder_02;
  StringPtr targetsFlagName_00;
  bool bVar1;
  Which WVar2;
  uint uVar3;
  uint32_t uVar4;
  unsigned_long *puVar5;
  BrandScope *this_00;
  uint64_t value;
  Reader RVar6;
  undefined4 uVar7;
  ReaderFor<capnp::schema::Node> local_4a0;
  undefined1 local_470 [8];
  BuilderFor<capnp::schema::Node::SourceInfo> di;
  Reader local_438;
  Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> local_408;
  Fault local_3e8;
  Fault f;
  char *local_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  Reader local_3a8;
  Reader local_378;
  StringPtr local_348;
  undefined1 local_338 [40];
  Reader local_310;
  StringPtr local_2d8;
  undefined1 local_2c8 [40];
  Reader local_2a0;
  StringPtr local_268;
  Builder local_258;
  Reader local_230;
  StringPtr local_200;
  Builder local_1f0;
  Reader local_1c8;
  StringPtr local_198;
  undefined1 auStack_188 [8];
  StringPtr targetsFlagName;
  Builder local_138;
  unsigned_long local_110;
  unsigned_long i;
  Iterator __end3;
  Iterator __begin3;
  Range<unsigned_long> *__range3;
  Builder paramsBuilder;
  Reader genericParams;
  Reader local_78;
  DuplicateNameDetector local_48;
  NodeTranslator *local_10;
  NodeTranslator *this_local;
  
  local_10 = this;
  DuplicateNameDetector::DuplicateNameDetector(&local_48,this->errorReporter);
  Declaration::Reader::getNestedDecls(&local_78,&decl);
  WVar2 = Declaration::Reader::which(&decl);
  uVar7 = local_78.reader._36_4_;
  nestedDecls.reader.capTable._0_4_ = (int)local_78.reader.capTable;
  nestedDecls.reader.segment = local_78.reader.segment;
  nestedDecls.reader.capTable._4_4_ = (int)((ulong)local_78.reader.capTable >> 0x20);
  nestedDecls.reader.ptr._0_4_ = (int)local_78.reader.ptr;
  nestedDecls.reader.ptr._4_4_ = (int)((ulong)local_78.reader.ptr >> 0x20);
  nestedDecls.reader.elementCount = local_78.reader.elementCount;
  nestedDecls.reader.step = local_78.reader.step;
  nestedDecls.reader.structDataSize = local_78.reader.structDataSize;
  nestedDecls.reader.structPointerCount = (short)uVar7;
  nestedDecls.reader.elementSize = (char)((uint)uVar7 >> 0x10);
  nestedDecls.reader._39_1_ = (char)((uint)uVar7 >> 0x18);
  nestedDecls.reader.nestingLimit = local_78.reader.nestingLimit;
  nestedDecls.reader._44_4_ = local_78.reader._44_4_;
  DuplicateNameDetector::check(&local_48,nestedDecls,WVar2);
  DuplicateNameDetector::~DuplicateNameDetector(&local_48);
  Declaration::Reader::getParameters((Reader *)&paramsBuilder.builder.structDataSize,&decl);
  uVar3 = List<capnp::compiler::Declaration::BrandParameter,_(capnp::Kind)3>::Reader::size
                    ((Reader *)&paramsBuilder.builder.structDataSize);
  if (uVar3 != 0) {
    uVar3 = List<capnp::compiler::Declaration::BrandParameter,_(capnp::Kind)3>::Reader::size
                      ((Reader *)&paramsBuilder.builder.structDataSize);
    capnp::schema::Node::Builder::initParameters((Builder *)&__range3,&builder,uVar3);
    ___begin3 = kj::
                indices<capnp::List<capnp::compiler::Declaration::BrandParameter,(capnp::Kind)3>::Reader&>
                          ((Reader *)&paramsBuilder.builder.structDataSize);
    __end3 = kj::Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin3);
    i = (unsigned_long)kj::Range<unsigned_long>::end((Range<unsigned_long> *)&__begin3);
    while (bVar1 = kj::Range<unsigned_long>::Iterator::operator==(&__end3,(Iterator *)&i),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      puVar5 = kj::Range<unsigned_long>::Iterator::operator*(&__end3);
      local_110 = *puVar5;
      List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Builder::operator[]
                (&local_138,(Builder *)&__range3,(uint)local_110);
      List<capnp::compiler::Declaration::BrandParameter,_(capnp::Kind)3>::Reader::operator[]
                ((Reader *)&targetsFlagName.content.size_,
                 (Reader *)&paramsBuilder.builder.structDataSize,(uint)local_110);
      RVar6 = Declaration::BrandParameter::Reader::getName((Reader *)&targetsFlagName.content.size_)
      ;
      capnp::schema::Node::Parameter::Builder::setName(&local_138,RVar6);
      kj::Range<unsigned_long>::Iterator::operator++(&__end3);
    }
  }
  this_00 = kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::operator->(&this->localBrand);
  bVar1 = BrandScope::isGeneric(this_00);
  capnp::schema::Node::Builder::setIsGeneric(&builder,bVar1);
  kj::StringPtr::StringPtr((StringPtr *)auStack_188);
  WVar2 = Declaration::Reader::which(&decl);
  switch(WVar2) {
  case FILE:
    kj::StringPtr::StringPtr(&local_198,"targetsFile");
    auStack_188 = (undefined1  [8])local_198.content.ptr;
    targetsFlagName.content.ptr = (char *)local_198.content.size_;
    break;
  default:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
              (&local_3e8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
               ,0x2b2,FAILED,(char *)0x0,"\"This Declaration is not a node.\"",
               (char (*) [32])"This Declaration is not a node.");
    kj::_::Debug::Fault::fatal(&local_3e8);
  case CONST:
    Declaration::Reader::getConst(&local_1c8,&decl);
    capnp::schema::Node::Builder::initConst(&local_1f0,&builder);
    decl_00._reader.capTable._0_4_ = (int)local_1c8._reader.capTable;
    decl_00._reader.segment = local_1c8._reader.segment;
    decl_00._reader.capTable._4_4_ = (int)((ulong)local_1c8._reader.capTable >> 0x20);
    decl_00._reader.data._0_4_ = (int)local_1c8._reader.data;
    decl_00._reader.data._4_4_ = (int)((ulong)local_1c8._reader.data >> 0x20);
    decl_00._reader.pointers._0_4_ = (int)local_1c8._reader.pointers;
    decl_00._reader.pointers._4_4_ = (int)((ulong)local_1c8._reader.pointers >> 0x20);
    decl_00._reader.dataSize = local_1c8._reader.dataSize;
    decl_00._reader._36_4_ = local_1c8._reader._36_4_;
    decl_00._reader.nestingLimit = local_1c8._reader.nestingLimit;
    decl_00._reader._44_4_ = local_1c8._reader._44_4_;
    builder_00._builder.capTable = local_1f0._builder.capTable;
    builder_00._builder.segment = local_1f0._builder.segment;
    builder_00._builder.data = local_1f0._builder.data;
    builder_00._builder.pointers = local_1f0._builder.pointers;
    builder_00._builder.dataSize = local_1f0._builder.dataSize;
    builder_00._builder.pointerCount = local_1f0._builder.pointerCount;
    builder_00._builder._38_2_ = local_1f0._builder._38_2_;
    compileConst(this,decl_00,builder_00);
    kj::StringPtr::StringPtr(&local_200,"targetsConst");
    auStack_188 = (undefined1  [8])local_200.content.ptr;
    targetsFlagName.content.ptr = (char *)local_200.content.size_;
    break;
  case ENUM:
    Declaration::Reader::getEnum(&decl);
    Declaration::Reader::getNestedDecls(&local_2a0,&decl);
    memcpy(local_2c8,&builder,0x28);
    compileEnum(this);
    kj::StringPtr::StringPtr(&local_2d8,"targetsEnum");
    auStack_188 = (undefined1  [8])local_2d8.content.ptr;
    targetsFlagName.content.ptr = (char *)local_2d8.content.size_;
    break;
  case STRUCT:
    Declaration::Reader::getStruct(&decl);
    Declaration::Reader::getNestedDecls(&local_310,&decl);
    memcpy(local_338,&builder,0x28);
    compileStruct(this);
    kj::StringPtr::StringPtr(&local_348,"targetsStruct");
    auStack_188 = (undefined1  [8])local_348.content.ptr;
    targetsFlagName.content.ptr = (char *)local_348.content.size_;
    break;
  case INTERFACE:
    Declaration::Reader::getInterface(&local_378,&decl);
    Declaration::Reader::getNestedDecls(&local_3a8,&decl);
    memcpy(&local_3d0,&builder,0x28);
    decl_02._reader.capTable._0_4_ = (int)local_378._reader.capTable;
    decl_02._reader.segment = local_378._reader.segment;
    decl_02._reader.capTable._4_4_ = (int)((ulong)local_378._reader.capTable >> 0x20);
    decl_02._reader.data._0_4_ = (int)local_378._reader.data;
    decl_02._reader.data._4_4_ = (int)((ulong)local_378._reader.data >> 0x20);
    decl_02._reader.pointers._0_4_ = (int)local_378._reader.pointers;
    decl_02._reader.pointers._4_4_ = (int)((ulong)local_378._reader.pointers >> 0x20);
    decl_02._reader.dataSize = local_378._reader.dataSize;
    decl_02._reader._36_4_ = local_378._reader._36_4_;
    decl_02._reader.nestingLimit = local_378._reader.nestingLimit;
    decl_02._reader._44_4_ = local_378._reader._44_4_;
    members.reader.capTable = local_3a8.reader.capTable;
    members.reader.segment = local_3a8.reader.segment;
    members.reader.ptr = local_3a8.reader.ptr;
    members.reader.elementCount = local_3a8.reader.elementCount;
    members.reader.step = local_3a8.reader.step;
    members.reader.structDataSize = local_3a8.reader.structDataSize;
    members.reader.structPointerCount = local_3a8.reader.structPointerCount;
    members.reader.elementSize = local_3a8.reader.elementSize;
    members.reader._39_1_ = local_3a8.reader._39_1_;
    members.reader.nestingLimit = local_3a8.reader.nestingLimit;
    members.reader._44_4_ = local_3a8.reader._44_4_;
    builder_02._builder.capTable = (CapTableBuilder *)uStack_3c8;
    builder_02._builder.segment = (SegmentBuilder *)local_3d0;
    builder_02._builder.data = (void *)local_3c0;
    builder_02._builder.pointers = (WirePointer *)uStack_3b8;
    builder_02._builder.dataSize = (undefined4)local_3b0;
    builder_02._builder.pointerCount = local_3b0._4_2_;
    builder_02._builder._38_2_ = local_3b0._6_2_;
    compileInterface(this,decl_02,members,builder_02);
    kj::StringPtr::StringPtr((StringPtr *)&f,"targetsInterface");
    auStack_188 = (undefined1  [8])f.exception;
    targetsFlagName.content.ptr = local_3d8;
    break;
  case ANNOTATION:
    Declaration::Reader::getAnnotation(&local_230,&decl);
    capnp::schema::Node::Builder::initAnnotation(&local_258,&builder);
    decl_01._reader.capTable._0_4_ = (int)local_230._reader.capTable;
    decl_01._reader.segment = local_230._reader.segment;
    decl_01._reader.capTable._4_4_ = (int)((ulong)local_230._reader.capTable >> 0x20);
    decl_01._reader.data._0_4_ = (int)local_230._reader.data;
    decl_01._reader.data._4_4_ = (int)((ulong)local_230._reader.data >> 0x20);
    decl_01._reader.pointers._0_4_ = (int)local_230._reader.pointers;
    decl_01._reader.pointers._4_4_ = (int)((ulong)local_230._reader.pointers >> 0x20);
    decl_01._reader.dataSize = local_230._reader.dataSize;
    decl_01._reader._36_4_ = local_230._reader._36_4_;
    decl_01._reader.nestingLimit = local_230._reader.nestingLimit;
    decl_01._reader._44_4_ = local_230._reader._44_4_;
    builder_01._builder.capTable = local_258._builder.capTable;
    builder_01._builder.segment = local_258._builder.segment;
    builder_01._builder.data = local_258._builder.data;
    builder_01._builder.pointers = local_258._builder.pointers;
    builder_01._builder.dataSize = local_258._builder.dataSize;
    builder_01._builder.pointerCount = local_258._builder.pointerCount;
    builder_01._builder._38_2_ = local_258._builder._38_2_;
    compileAnnotation(this,decl_01,builder_01);
    kj::StringPtr::StringPtr(&local_268,"targetsAnnotation");
    auStack_188 = (undefined1  [8])local_268.content.ptr;
    targetsFlagName.content.ptr = (char *)local_268.content.size_;
  }
  uVar4 = Declaration::Reader::getStartByte(&decl);
  capnp::schema::Node::Builder::setStartByte(&builder,uVar4);
  uVar4 = Declaration::Reader::getEndByte(&decl);
  capnp::schema::Node::Builder::setEndByte(&builder,uVar4);
  Declaration::Reader::getAnnotations(&local_438,&decl);
  di._builder.dataSize = auStack_188._0_4_;
  di._builder.pointerCount = auStack_188._4_2_;
  di._builder._38_2_ = auStack_188._6_2_;
  targetsFlagName_00.content.size_ = (size_t)targetsFlagName.content.ptr;
  targetsFlagName_00.content.ptr = (char *)auStack_188;
  uVar7 = local_438.reader._36_4_;
  annotations.reader.capTable._0_4_ = (int)local_438.reader.capTable;
  annotations.reader.segment = local_438.reader.segment;
  annotations.reader.capTable._4_4_ = (int)((ulong)local_438.reader.capTable >> 0x20);
  annotations.reader.ptr._0_4_ = (int)local_438.reader.ptr;
  annotations.reader.ptr._4_4_ = (int)((ulong)local_438.reader.ptr >> 0x20);
  annotations.reader.elementCount = local_438.reader.elementCount;
  annotations.reader.step = local_438.reader.step;
  annotations.reader.structDataSize = local_438.reader.structDataSize;
  annotations.reader.structPointerCount = (short)uVar7;
  annotations.reader.elementSize = (char)((uint)uVar7 >> 0x10);
  annotations.reader._39_1_ = (char)((uint)uVar7 >> 0x18);
  annotations.reader.nestingLimit = local_438.reader.nestingLimit;
  annotations.reader._44_4_ = local_438.reader._44_4_;
  compileAnnotationApplications(&local_408,this,annotations,targetsFlagName_00);
  capnp::schema::Node::Builder::adoptAnnotations(&builder,&local_408);
  Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_>::~Orphan(&local_408);
  Orphan<capnp::schema::Node::SourceInfo>::get
            ((BuilderFor<capnp::schema::Node::SourceInfo> *)local_470,&this->sourceInfo);
  Orphan<capnp::schema::Node>::getReader(&local_4a0,&this->wipNode);
  value = capnp::schema::Node::Reader::getId(&local_4a0);
  capnp::schema::Node::SourceInfo::Builder::setId((Builder *)local_470,value);
  bVar1 = Declaration::Reader::hasDocComment(&decl);
  if (bVar1) {
    RVar6 = Declaration::Reader::getDocComment(&decl);
    capnp::schema::Node::SourceInfo::Builder::setDocComment((Builder *)local_470,RVar6);
  }
  uVar4 = Declaration::Reader::getStartByte(&decl);
  capnp::schema::Node::SourceInfo::Builder::setStartByte((Builder *)local_470,uVar4);
  uVar4 = Declaration::Reader::getEndByte(&decl);
  capnp::schema::Node::SourceInfo::Builder::setEndByte((Builder *)local_470,uVar4);
  return;
}

Assistant:

void NodeTranslator::compileNode(Declaration::Reader decl, schema::Node::Builder builder) {
  DuplicateNameDetector(errorReporter)
      .check(decl.getNestedDecls(), decl.which());

  auto genericParams = decl.getParameters();
  if (genericParams.size() > 0) {
    auto paramsBuilder = builder.initParameters(genericParams.size());
    for (auto i: kj::indices(genericParams)) {
      paramsBuilder[i].setName(genericParams[i].getName());
    }
  }

  builder.setIsGeneric(localBrand->isGeneric());

  kj::StringPtr targetsFlagName;

  switch (decl.which()) {
    case Declaration::FILE:
      targetsFlagName = "targetsFile";
      break;
    case Declaration::CONST:
      compileConst(decl.getConst(), builder.initConst());
      targetsFlagName = "targetsConst";
      break;
    case Declaration::ANNOTATION:
      compileAnnotation(decl.getAnnotation(), builder.initAnnotation());
      targetsFlagName = "targetsAnnotation";
      break;
    case Declaration::ENUM:
      compileEnum(decl.getEnum(), decl.getNestedDecls(), builder);
      targetsFlagName = "targetsEnum";
      break;
    case Declaration::STRUCT:
      compileStruct(decl.getStruct(), decl.getNestedDecls(), builder);
      targetsFlagName = "targetsStruct";
      break;
    case Declaration::INTERFACE:
      compileInterface(decl.getInterface(), decl.getNestedDecls(), builder);
      targetsFlagName = "targetsInterface";
      break;

    default:
      KJ_FAIL_REQUIRE("This Declaration is not a node.");
      break;
  }

  builder.setStartByte(decl.getStartByte());
  builder.setEndByte(decl.getEndByte());

  builder.adoptAnnotations(compileAnnotationApplications(decl.getAnnotations(), targetsFlagName));

  auto di = sourceInfo.get();
  di.setId(wipNode.getReader().getId());
  if (decl.hasDocComment()) {
    di.setDocComment(decl.getDocComment());
  }
  di.setStartByte(decl.getStartByte());
  di.setEndByte(decl.getEndByte());
}